

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boost_unordered.hpp
# Opt level: O3

void __thiscall
boost::unordered::
unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::PrimitiveSymbol_*,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::PrimitiveSymbol_*>_>_>
::~unordered_flat_map
          (unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::PrimitiveSymbol_*,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::PrimitiveSymbol_*>_>_>
           *this)

{
  value_type_pointer p;
  
  p = (this->table_).
      super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_const_slang::ast::PrimitiveSymbol_*>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_const_slang::ast::PrimitiveSymbol_*>_>_>
      .arrays.elements_;
  if (p != (value_type_pointer)0x0) {
    operator_delete(p,(((this->table_).
                        super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_const_slang::ast::PrimitiveSymbol_*>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_const_slang::ast::PrimitiveSymbol_*>_>_>
                        .arrays.groups_size_mask * 0x178 + 0x186) / 3 & 0xfffffffffffffff8) * 3);
    return;
  }
  return;
}

Assistant:

~unordered_flat_map() = default;